

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.cpp
# Opt level: O0

MeshGL * Csaszar(void)

{
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_int> __l_00;
  initializer_list<float> __l_01;
  MeshGLP<float,_unsigned_int> *in_RDI;
  uint local_164;
  iterator local_160;
  undefined8 local_158;
  uint local_150 [42];
  iterator local_a8;
  undefined8 local_a0;
  float local_88 [24];
  iterator local_28;
  undefined8 local_20;
  undefined1 local_11;
  MeshGL *csaszar;
  
  local_11 = 0;
  manifold::MeshGLP<float,_unsigned_int>::MeshGLP(in_RDI);
  in_RDI->numProp = 3;
  local_88[0x10] = -20.0;
  local_88[0x11] = -15.0;
  local_88[0x12] = 20.0;
  local_88[0x13] = 20.0;
  local_88[0xc] = 5.0;
  local_88[0xd] = 8.0;
  local_88[0xe] = 8.0;
  local_88[0xf] = 20.0;
  local_88[8] = 8.0;
  local_88[9] = 0.0;
  local_88[10] = 0.0;
  local_88[0xb] = 30.0;
  local_88[4] = 20.0;
  local_88[5] = -15.0;
  local_88[6] = -5.0;
  local_88[7] = -8.0;
  local_88[0] = -20.0;
  local_88[1] = -20.0;
  local_88[2] = -10.0;
  local_88[3] = -20.0;
  local_88[0x14] = -10.0;
  local_28 = local_88;
  local_20 = 0x15;
  __l_01._M_len = 0x15;
  __l_01._M_array = local_28;
  std::vector<float,_std::allocator<float>_>::operator=(&in_RDI->vertProperties,__l_01);
  memcpy(local_150,&DAT_0022d0bc,0xa8);
  local_a0 = 0x2a;
  __l_00._M_len = 0x2a;
  __l_00._M_array = local_150;
  local_a8 = local_150;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(&in_RDI->triVerts,__l_00);
  local_164 = manifold::Manifold::ReserveIDs(1);
  local_160 = &local_164;
  local_158 = 1;
  __l._M_len = 1;
  __l._M_array = local_160;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(&in_RDI->runOriginalID,__l);
  return in_RDI;
}

Assistant:

MeshGL Csaszar() {
  MeshGL csaszar;
  csaszar.numProp = 3;
  csaszar.vertProperties = {-20, -20, -10,  //
                            -20, 20,  -15,  //
                            -5,  -8,  8,    //
                            0,   0,   30,   //
                            5,   8,   8,    //
                            20,  -20, -15,  //
                            20,  20,  -10};
  csaszar.triVerts = {1, 3, 6,  //
                      1, 6, 5,  //
                      2, 5, 6,  //
                      0, 2, 6,  //
                      0, 6, 4,  //
                      3, 4, 6,  //
                      1, 2, 3,  //
                      1, 4, 2,  //
                      1, 0, 4,  //
                      1, 5, 0,  //
                      3, 5, 4,  //
                      0, 5, 3,  //
                      0, 3, 2,  //
                      2, 4, 5};
  csaszar.runOriginalID = {Manifold::ReserveIDs(1)};
  return csaszar;
}